

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Revision.cpp
# Opt level: O0

string * __thiscall OpenMD::Revision::getRevision_abi_cxx11_(Revision *this)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  string *in_RDI;
  string rev;
  string *r;
  allocator local_39;
  string local_38 [39];
  byte local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI);
  sVar2 = strnlen("b695faef3ed5d340f31b6fe104e8b5c263b0a1f4",0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"b695faef3ed5d340f31b6fe104e8b5c263b0a1f4",sVar2,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  cVar1 = std::__cxx11::string::length();
  std::__cxx11::string::append((ulong)local_38,'(' - cVar1);
  std::__cxx11::string::append((char *)in_RDI);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::append((string *)in_RDI);
  }
  else {
    std::__cxx11::string::append((char *)in_RDI);
  }
  local_11 = 1;
  std::__cxx11::string::~string(local_38);
  if ((local_11 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string Revision::getRevision() {
    std::string r;
    std::string rev(revision, strnlen(revision, 40));
    rev.append(40 - rev.length(), ' ');
    r.append("Revision: ");
    // If there's no GIT SHA1 revision, just call this the RELEASE revision.
    if (!rev.empty()) {
      r.append(rev);
    } else {
      r.append("RELEASE");
    }
    return r;
  }